

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGTryCompile(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr_conflict local_30;
  xmlRelaxNGDefinePtr_conflict list;
  int ret;
  xmlRelaxNGDefinePtr_conflict def_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  list._4_4_ = 0;
  if ((ctxt == (xmlRelaxNGParserCtxtPtr)0x0) || (def == (xmlRelaxNGDefinePtr_conflict)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else if ((((def->type == XML_RELAXNG_START) || (def->type == XML_RELAXNG_ELEMENT)) &&
           (list._4_4_ = xmlRelaxNGIsCompilable(def), (def->dflags & 0x40U) != 0)) &&
          (def->depth != -0x19)) {
    ctxt->am = (xmlAutomataPtr)0x0;
    ctxt_local._4_4_ = xmlRelaxNGCompile(ctxt,def);
  }
  else {
    switch(def->type) {
    case XML_RELAXNG_EMPTY:
    case XML_RELAXNG_TEXT:
    case XML_RELAXNG_ELEMENT:
    case XML_RELAXNG_DATATYPE:
    case XML_RELAXNG_PARAM:
    case XML_RELAXNG_VALUE:
    case XML_RELAXNG_LIST:
      list._4_4_ = 0;
      break;
    case XML_RELAXNG_NOT_ALLOWED:
    case XML_RELAXNG_EXCEPT:
    case XML_RELAXNG_ATTRIBUTE:
    case XML_RELAXNG_INTERLEAVE:
      list._4_4_ = 0;
      break;
    case XML_RELAXNG_DEF:
    case XML_RELAXNG_REF:
    case XML_RELAXNG_EXTERNALREF:
    case XML_RELAXNG_PARENTREF:
    case XML_RELAXNG_OPTIONAL:
    case XML_RELAXNG_ZEROORMORE:
    case XML_RELAXNG_ONEORMORE:
    case XML_RELAXNG_CHOICE:
    case XML_RELAXNG_GROUP:
    case XML_RELAXNG_START:
      local_30 = def->content;
      while ((local_30 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
             (list._4_4_ = xmlRelaxNGTryCompile(ctxt,local_30), list._4_4_ == 0))) {
        local_30 = local_30->next;
      }
      break;
    case XML_RELAXNG_NOOP:
      list._4_4_ = xmlRelaxNGTryCompile(ctxt,def->content);
    }
    ctxt_local._4_4_ = list._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGTryCompile(xmlRelaxNGParserCtxtPtr ctxt, xmlRelaxNGDefinePtr def)
{
    int ret = 0;
    xmlRelaxNGDefinePtr list;

    if ((ctxt == NULL) || (def == NULL))
        return (-1);

    if ((def->type == XML_RELAXNG_START) ||
        (def->type == XML_RELAXNG_ELEMENT)) {
        ret = xmlRelaxNGIsCompilable(def);
        if ((def->dflags & IS_COMPILABLE) && (def->depth != -25)) {
            ctxt->am = NULL;
            ret = xmlRelaxNGCompile(ctxt, def);
            return (ret);
        }
    }
    switch (def->type) {
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGTryCompile(ctxt, def->content);
            break;
        case XML_RELAXNG_TEXT:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_EMPTY:
        case XML_RELAXNG_ELEMENT:
            ret = 0;
            break;
        case XML_RELAXNG_OPTIONAL:
        case XML_RELAXNG_ZEROORMORE:
        case XML_RELAXNG_ONEORMORE:
        case XML_RELAXNG_CHOICE:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_START:
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
            list = def->content;
            while (list != NULL) {
                ret = xmlRelaxNGTryCompile(ctxt, list);
                if (ret != 0)
                    break;
                list = list->next;
            }
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_NOT_ALLOWED:
            ret = 0;
            break;
    }
    return (ret);
}